

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity.c
# Opt level: O1

void unittest_callback(gravity_vm *vm,error_type_t error_type,char *description,char *notes,
                      gravity_value_t value,int32_t row,int32_t col,void *xdata)

{
  *(error_type_t *)((long)xdata + 0x10) = error_type;
  *(gravity_class_t **)((long)xdata + 0x18) = value.isa;
  ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)((long)xdata + 0x20))->n =
       (gravity_int_t)value.field_1;
  *(int32_t *)((long)xdata + 0x28) = row;
  *(int32_t *)((long)xdata + 0x2c) = col;
  if (notes != (char *)0x0) {
    printf("\tNOTE: %s\n",notes);
  }
  printf("\t%s\n",description);
  return;
}

Assistant:

static void unittest_callback (gravity_vm *vm, error_type_t error_type, const char *description, const char *notes, gravity_value_t value, int32_t row, int32_t col, void *xdata) {
    (void) vm;
    unittest_data *data = (unittest_data *)xdata;
    data->expected_error = error_type;
    data->expected_value = value;
    data->expected_row = row;
    data->expected_col = col;
    
    if (notes) printf("\tNOTE: %s\n", notes);
    printf("\t%s\n", description);
}